

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::locate_soi_marker(jpeg_decoder *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  uVar1 = get_bits(this,8);
  uVar2 = get_bits(this,8);
  if (uVar2 == 0xd8 && uVar1 == 0xff) {
    return;
  }
  iVar3 = -0xfff;
  do {
    if (iVar3 == 0) {
LAB_0013c7ed:
      stop_decoding(this,JPGD_NOT_JPEG);
    }
    uVar1 = get_bits(this,8);
    if (uVar2 == 0xff) {
      if (uVar1 == 0xd8) {
        if (0xfeffffff < this->m_bit_buf) {
          return;
        }
        goto LAB_0013c7ed;
      }
      if (uVar1 == 0xd9) goto LAB_0013c7ed;
    }
    iVar3 = iVar3 + 1;
    uVar2 = uVar1;
  } while( true );
}

Assistant:

void jpeg_decoder::locate_soi_marker()
	{
		uint lastchar, thischar;
		uint bytesleft;

		lastchar = get_bits(8);

		thischar = get_bits(8);

		/* ok if it's a normal JPEG file without a special header */

		if ((lastchar == 0xFF) && (thischar == M_SOI))
			return;

		bytesleft = 4096;

		for (; ; )
		{
			if (--bytesleft == 0)
				stop_decoding(JPGD_NOT_JPEG);

			lastchar = thischar;

			thischar = get_bits(8);

			if (lastchar == 0xFF)
			{
				if (thischar == M_SOI)
					break;
				else if (thischar == M_EOI) // get_bits will keep returning M_EOI if we read past the end
					stop_decoding(JPGD_NOT_JPEG);
			}
		}

		// Check the next character after marker: if it's not 0xFF, it can't be the start of the next marker, so the file is bad.
		thischar = (m_bit_buf >> 24) & 0xFF;

		if (thischar != 0xFF)
			stop_decoding(JPGD_NOT_JPEG);
	}